

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Test_cancelled(MPIABI_Status *status,int *flag)

{
  int iVar1;
  MPI_Status *pMVar2;
  WPI_const_StatusPtr local_20;
  int *local_18;
  int *flag_local;
  MPIABI_Status *status_local;
  
  local_18 = flag;
  flag_local = (int *)status;
  WPI_const_StatusPtr::WPI_const_StatusPtr(&local_20,status);
  pMVar2 = WPI_const_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_20);
  iVar1 = MPI_Test_cancelled(pMVar2,local_18);
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_20);
  return iVar1;
}

Assistant:

int MPIABI_Test_cancelled(
  const MPIABI_Status * status,
  int * flag
) {
  return MPI_Test_cancelled(
    (const MPI_Status *)(WPI_const_StatusPtr)status,
    flag
  );
}